

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  double dVar4;
  int iVar5;
  void *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type sVar8;
  string *extraout_RAX;
  ulong extraout_RAX_00;
  string *psVar9;
  long lVar10;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *pcVar13;
  bool numOnly;
  bool numOnly_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  bool numOnly_01;
  bool numOnly_02;
  bool numOnly_03;
  bool numOnly_04;
  bool numOnly_05;
  bool numOnly_06;
  bool numOnly_07;
  undefined1 extraout_DL_01;
  bool numOnly_08;
  undefined1 extraout_DL_02;
  bool numOnly_09;
  undefined1 extraout_DL_03;
  bool numOnly_10;
  size_t extraout_RDX;
  size_t __n;
  size_type __pos;
  byte bVar14;
  ulong uVar15;
  char *__data;
  undefined1 uVar16;
  string muxstr;
  undefined1 local_98 [36];
  undefined4 local_74;
  string local_70;
  string local_50;
  
  iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,3,"m^3"
                 );
  if (iVar5 == 0) {
    if (0.1 < mux) {
LAB_003e61be:
      bVar14 = 0;
    }
    else {
      pcVar13 = "L";
      sVar8 = 3;
LAB_003e617e:
      bVar14 = 0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,sVar8,
                 pcVar13,1);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,4,
                    "m^-3");
    if (iVar5 == 0) {
      if (mux <= 100.0) goto LAB_003e61be;
      pcVar13 = "L^-1";
      sVar8 = 4;
LAB_003e61e3:
      bVar14 = 0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,sVar8,
                 pcVar13,4);
      mux = mux / 1000.0;
    }
    else {
      iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,5,
                      "kg^-1");
      if (iVar5 == 0) {
        bVar14 = 1;
        if (100.0 < mux) {
          pcVar13 = "g^-1";
          sVar8 = 5;
          goto LAB_003e61e3;
        }
      }
      else {
        bVar14 = 0;
        iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0
                          ,2,"kg");
        if (((iVar5 == 0) && (bVar14 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcVar13 = "g";
          sVar8 = 2;
          goto LAB_003e617e;
        }
      }
    }
  }
  pcVar13 = (seq->_M_dataplus)._M_p;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (*pcVar13 == '/') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,0,0,1,
                     '1');
      pcVar13 = (seq->_M_dataplus)._M_p;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &seq->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar13 == paVar1) {
      uVar11 = *(undefined8 *)((long)&seq->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = seq->_M_string_length;
    (seq->_M_dataplus)._M_p = (pointer)paVar1;
    seq->_M_string_length = 0;
    (seq->field_2)._M_local_buf[0] = '\0';
    return (string *)paVar1;
  }
  __n = seq->_M_string_length;
  if (*pcVar13 == '/') {
    if (__n == 0) {
LAB_003e6401:
      uVar16 = (undefined1)__n;
LAB_003e6416:
      local_98._0_8_ = local_98 + 0x10;
      local_98[0x10] = '\0';
      local_98._8_8_ = 0;
      getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,1.0 / mux,(bool)uVar16);
      generateUnitSequence();
      if ((extraout_RAX_00 & 1) == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,1,0,
                local_50._M_dataplus._M_p,local_98._8_8_);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,0,
                   local_98._8_8_,"1",1);
      }
      else {
        getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_00);
        generateUnitSequence();
      }
    }
    else {
      pvVar6 = memchr(pcVar13,0x5e,__n);
      uVar16 = (long)pvVar6 - (long)pcVar13 != -1;
      __n = (size_t)(byte)uVar16;
      if (pvVar6 == (void *)0x0 || !(bool)uVar16) goto LAB_003e6401;
      cVar2 = pcVar13[((long)pvVar6 - (long)pcVar13) + 1];
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      if (cVar2 != '3') {
        if (cVar2 == '2') {
          dVar4 = 1.0 / mux;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
            uVar16 = extraout_DL_01;
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,(bool)uVar16);
          generateUnitSequence();
          if ((extraout_RAX_05 & 1) == 0) goto LAB_003e6822;
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_08);
          generateUnitSequence();
          goto LAB_003e6482;
        }
        if (cVar2 != '1') {
          getMultiplierString_abi_cxx11_(&local_70,(units *)0x1,mux,(bool)uVar16);
          generateUnitSequence();
          goto LAB_003e6482;
        }
        goto LAB_003e6416;
      }
      dVar4 = cbrt(1.0 / mux);
      getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,numOnly_03);
      generateUnitSequence();
      if ((extraout_RAX_02 & 1) == 0) {
LAB_003e6822:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,1,0,
                local_50._M_dataplus._M_p,local_98._8_8_);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,0,
                   local_98._8_8_,"1",1);
      }
      else {
        getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_04);
        generateUnitSequence();
      }
    }
LAB_003e6482:
    psVar9 = (string *)
             std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)seq);
LAB_003e68e3:
    if ((string *)local_98._0_8_ == (string *)(local_98 + 0x10)) {
      return psVar9;
    }
    goto LAB_003e636d;
  }
  if (__n == 0) {
LAB_003e628e:
    getMultiplierString_abi_cxx11_((string *)local_98,(units *)(ulong)bVar14,mux,SUB81(__n,0));
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(seq->_M_dataplus)._M_p,seq->_M_string_length);
  }
  else {
    pvVar6 = memchr(pcVar13,0x5e,__n);
    uVar15 = (long)pvVar6 - (long)pcVar13;
    __n = extraout_RDX;
    if (pvVar6 == (void *)0x0 || uVar15 == 0xffffffffffffffff) goto LAB_003e628e;
    sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,
                          "*/)",0,3);
    if (uVar15 <= sVar8) {
      __pos = ((seq->_M_dataplus)._M_p[uVar15 + 1] == '(') + uVar15 + 1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seq,__pos,
                 (sVar8 - __pos) + 1);
      uVar11 = local_98._0_8_;
      psVar9 = (string *)__errno_location();
      local_74 = *(undefined4 *)&(psVar9->_M_dataplus)._M_p;
      *(undefined4 *)&(psVar9->_M_dataplus)._M_p = 0;
      lVar10 = strtol((char *)uVar11,(char **)&local_70,10);
      if (local_70._M_dataplus._M_p == (pointer)uVar11) {
        std::__throw_invalid_argument("stoi");
LAB_003e6951:
        uVar11 = std::__throw_out_of_range("stoi");
        if ((string *)local_98._0_8_ != psVar9) {
          operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
        }
        _Unwind_Resume(uVar11);
      }
      if (((int)lVar10 != lVar10) || (iVar5 = *(int *)&(psVar9->_M_dataplus)._M_p, iVar5 == 0x22))
      goto LAB_003e6951;
      if (iVar5 == 0) {
        *(undefined4 *)&(psVar9->_M_dataplus)._M_p = local_74;
      }
      psVar9 = (string *)(local_98 + 0x10);
      uVar16 = extraout_DL;
      if ((string *)local_98._0_8_ != psVar9) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
        uVar16 = extraout_DL_00;
      }
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = psVar9;
      switch((int)lVar10) {
      default:
        getMultiplierString_abi_cxx11_(&local_70,(units *)0x1,mux,(bool)uVar16);
        generateUnitSequence();
        break;
      case 2:
        if (mux < 0.0) {
          dVar4 = sqrt(mux);
          uVar16 = extraout_DL_03;
        }
        else {
          dVar4 = SQRT(mux);
        }
        getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,(bool)uVar16);
        generateUnitSequence();
        if ((extraout_RAX_07 & 1) != 0) {
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_10);
          generateUnitSequence();
        }
        break;
      case 3:
        dVar4 = cbrt(mux);
        getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,numOnly_06);
        generateUnitSequence();
        if ((extraout_RAX_04 & 1) != 0) {
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_07);
          generateUnitSequence();
        }
        break;
      case -3:
        dVar4 = cbrt(1.0 / mux);
        getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,numOnly_01);
        generateUnitSequence();
        if ((extraout_RAX_01 & 1) != 0) {
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_02);
          generateUnitSequence();
        }
        break;
      case -2:
        dVar4 = 1.0 / mux;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
          uVar16 = extraout_DL_02;
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,dVar4,(bool)uVar16);
        generateUnitSequence();
        if ((extraout_RAX_06 & 1) != 0) {
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_09);
          generateUnitSequence();
        }
        break;
      case -1:
        getMultiplierString_abi_cxx11_(&local_70,(units *)(ulong)bVar14,1.0 / mux,(bool)uVar16);
        generateUnitSequence();
        if ((extraout_RAX_03 & 1) != 0) {
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,mux,numOnly_05);
          generateUnitSequence();
        }
      }
      psVar9 = (string *)
               std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __return_storage_ptr__,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)seq);
      goto LAB_003e68e3;
    }
    getMultiplierString_abi_cxx11_((string *)local_98,(units *)(ulong)bVar14,mux,numOnly);
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(seq->_M_dataplus)._M_p,seq->_M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar12) {
    uVar11 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((string *)local_98._0_8_ == (string *)(local_98 + 0x10)) {
    return (string *)(local_98 + 0x10);
  }
LAB_003e636d:
  operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  return extraout_RAX;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}